

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.cpp
# Opt level: O0

size_t __thiscall axl::io::psx::Socket::recvFrom(Socket *this,void *p,size_t size,SockAddr *addr)

{
  int iVar1;
  sockaddr *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int *in_RDI;
  int result;
  socklen_t addrSize;
  socklen_t *local_50;
  socklen_t local_24 [9];
  
  local_24[0] = 0x1c;
  if (in_RCX == (sockaddr *)0x0) {
    local_50 = (socklen_t *)0x0;
  }
  else {
    local_50 = local_24;
  }
  recvfrom(*in_RDI,in_RSI,in_RDX,0,in_RCX,local_50);
  iVar1 = err::complete<int>(0,0x175447);
  return (long)iVar1;
}

Assistant:

size_t
Socket::recvFrom(
	void* p,
	size_t size,
	SockAddr* addr
) {
	socklen_t addrSize = sizeof(SockAddr);
	int result = ::recvfrom(
		m_h,
		p,
		size,
		0,
		(sockaddr*)addr,
		addr ? &addrSize : NULL
	);

	return err::complete(result, -1);
}